

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerNewScopeSlots(Lowerer *this,Instr *instr,bool doStackSlots)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined8 uVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  uint uVar3;
  uint uVar4;
  Opnd *pOVar5;
  IntConstOpnd *this_01;
  RegOpnd *newObjDst;
  uint *puVar6;
  IndirOpnd *pIVar7;
  LabelInstr *this_02;
  Loop *pLVar8;
  StackSym *sym;
  RegOpnd *pRVar9;
  uint local_c4;
  uint i_2;
  Loop *loop;
  LabelInstr *loopTop;
  undefined1 local_a8 [4];
  uint i_1;
  AutoReuseOpnd autoReuseCurrOpnd;
  RegOpnd *currOpnd;
  uint leftOverAssignCount;
  uint loopAssignCount;
  uint nLoop;
  uint i;
  int loopUnrollCount;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseUndefinedOpnd;
  Opnd *undefinedOpnd;
  Opnd *functionInfoOpnd;
  RegOpnd *dst;
  uint local_30;
  uint actualSlotCount;
  uint allocSize;
  uint count;
  Func *func;
  Instr *pIStack_18;
  bool doStackSlots_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  _allocSize = this->m_func;
  func._7_1_ = doStackSlots;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(_allocSize);
  functionId = Func::GetLocalFunctionId(_allocSize);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,NewScopeSlotFastPathPhase,sourceContextId,functionId);
  if (bVar2) {
    LowerUnaryHelperMemWithFunctionInfo(this,pIStack_18,HelperOP_NewScopeSlots);
  }
  else {
    pOVar5 = IR::Instr::GetSrc1(pIStack_18);
    this_01 = IR::Opnd::AsIntConstOpnd(pOVar5);
    actualSlotCount = IR::IntConstOpnd::AsUint32(this_01);
    local_30 = actualSlotCount << 3;
    dst._4_4_ = actualSlotCount - 2;
    pOVar5 = IR::Instr::UnlinkDst(pIStack_18);
    newObjDst = IR::Opnd::AsRegOpnd(pOVar5);
    if ((func._7_1_ & 1) == 0) {
      GenerateRecyclerAlloc
                (this,HelperAllocMemForVarArray,(ulong)local_30,newObjDst,pIStack_18,false);
    }
    puVar6 = min<unsigned_int>((uint *)((long)&dst + 4),&Js::ScopeSlots::MaxEncodedSlotCount);
    LowererMD::GenerateMemInit
              (&this->m_lowererMD,newObjDst,0,(ulong)*puVar6,pIStack_18,
               (bool)((func._7_1_ ^ 0xff) & 1));
    pOVar5 = LoadFunctionInfoOpnd(this,pIStack_18);
    GenerateMemInit(this,newObjDst,8,pOVar5,pIStack_18,(bool)((func._7_1_ ^ 0xff) & 1));
    autoReuseUndefinedOpnd._16_8_ = LoadLibraryValueOpnd(this,pIStack_18,ValueUndefined);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)local_68,(Opnd *)autoReuseUndefinedOpnd._16_8_,_allocSize,true);
    if (2 < dst._4_4_) {
      autoReuseUndefinedOpnd._16_8_ =
           GetRegOpnd(this,(Opnd *)autoReuseUndefinedOpnd._16_8_,pIStack_18,_allocSize,TyVar);
    }
    if (dst._4_4_ < 0x11) {
      for (loopAssignCount = 2; loopAssignCount < actualSlotCount;
          loopAssignCount = loopAssignCount + 1) {
        GenerateMemInit(this,newObjDst,loopAssignCount << 3,(Opnd *)autoReuseUndefinedOpnd._16_8_,
                        pIStack_18,(bool)(~func._7_1_ & 1));
      }
    }
    else {
      uVar3 = dst._4_4_ >> 3;
      uVar4 = dst._4_4_ + uVar3 * -8;
      autoReuseCurrOpnd._16_8_ = IR::RegOpnd::New(TyUint64,_allocSize);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_a8,(Opnd *)autoReuseCurrOpnd._16_8_,this->m_func,true);
      uVar1 = autoReuseCurrOpnd._16_8_;
      pIVar7 = IR::IndirOpnd::New(newObjDst,uVar3 * 0x40 + -0x30,TyUint64,_allocSize,false);
      InsertLea((RegOpnd *)uVar1,&pIVar7->super_Opnd,pIStack_18);
      for (loopTop._4_4_ = 0; loopTop._4_4_ < uVar4; loopTop._4_4_ = loopTop._4_4_ + 1) {
        GenerateMemInit(this,(RegOpnd *)autoReuseCurrOpnd._16_8_,(uVar4 + ~loopTop._4_4_) * 8 + 0x40
                        ,(Opnd *)autoReuseUndefinedOpnd._16_8_,pIStack_18,(bool)(~func._7_1_ & 1));
      }
      this_02 = InsertLoopTopLabel(this,pIStack_18);
      pLVar8 = IR::LabelInstr::GetLoop(this_02);
      for (local_c4 = 0; uVar1 = autoReuseCurrOpnd._16_8_, local_c4 < 8; local_c4 = local_c4 + 1) {
        GenerateMemInit(this,(RegOpnd *)autoReuseCurrOpnd._16_8_,(7 - local_c4) * 8,
                        (Opnd *)autoReuseUndefinedOpnd._16_8_,pIStack_18,(bool)(~func._7_1_ & 1));
      }
      pIVar7 = IR::IndirOpnd::New((RegOpnd *)autoReuseCurrOpnd._16_8_,-0x40,TyUint64,_allocSize,
                                  false);
      InsertLea((RegOpnd *)uVar1,&pIVar7->super_Opnd,pIStack_18);
      InsertCompareBranch(this,&newObjDst->super_Opnd,(Opnd *)autoReuseCurrOpnd._16_8_,BrLt_A,true,
                          this_02,pIStack_18,false);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar8->regAlloc).liveOnBackEdgeSyms,
                 *(BVIndex *)(*(long *)(autoReuseCurrOpnd._16_8_ + 0x10) + 0x10));
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar8->regAlloc).liveOnBackEdgeSyms,(newObjDst->m_sym->super_Sym).m_id);
      this_00 = (pLVar8->regAlloc).liveOnBackEdgeSyms;
      pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)autoReuseUndefinedOpnd._16_8_);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pRVar9->m_sym->super_Sym).m_id);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
    }
    if ((func._7_1_ & 1) == 0) {
      sym = Func::GetLocalClosureSym(pIStack_18->m_func);
      pRVar9 = IR::RegOpnd::New(sym,TyUint64,_allocSize);
      InsertMove(&pRVar9->super_Opnd,&newObjDst->super_Opnd,pIStack_18,true);
    }
    IR::Instr::Remove(pIStack_18);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  }
  return;
}

Assistant:

void
Lowerer::LowerNewScopeSlots(IR::Instr * instr, bool doStackSlots)
{
    Func * func = m_func;
    if (PHASE_OFF(Js::NewScopeSlotFastPathPhase, func))
    {
        this->LowerUnaryHelperMemWithFunctionInfo(instr, IR::HelperOP_NewScopeSlots);
        return;
    }

    uint const count = instr->GetSrc1()->AsIntConstOpnd()->AsUint32();
    uint const allocSize = count * sizeof(Js::Var);
    uint const actualSlotCount = count - Js::ScopeSlots::FirstSlotIndex;

    IR::RegOpnd * dst = instr->UnlinkDst()->AsRegOpnd();

    // dst = RecyclerAlloc(allocSize)
    // dst[EncodedSlotCountSlotIndex] = min(actualSlotCount, MaxEncodedSlotCount);
    // dst[ScopeMetadataSlotIndex] = FunctionBody;
    // mov undefinedOpnd, undefined
    // dst[FirstSlotIndex..count] = undefinedOpnd;

    // Note: stack allocation of both scope slots and frame display are done together
    // in lowering of NewStackFrameDisplay
    if (!doStackSlots)
    {
        GenerateRecyclerAlloc(IR::HelperAllocMemForVarArray, allocSize, dst, instr);
    }

    m_lowererMD.GenerateMemInit(dst, Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
            (size_t)min<uint>(actualSlotCount, Js::ScopeSlots::MaxEncodedSlotCount), instr, !doStackSlots);

    IR::Opnd * functionInfoOpnd = this->LoadFunctionInfoOpnd(instr);
    GenerateMemInit(dst, Js::ScopeSlots::ScopeMetadataSlotIndex * sizeof(Js::Var),
        functionInfoOpnd, instr, !doStackSlots);

    IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);
    const IR::AutoReuseOpnd autoReuseUndefinedOpnd(undefinedOpnd, func);

    // avoid using a register for the undefined pointer if we are going to assign 1 or 2

    if (actualSlotCount > 2)
    {
        undefinedOpnd = GetRegOpnd(undefinedOpnd, instr, func, TyVar);
    }

    int const loopUnrollCount = 8;

    if (actualSlotCount <= loopUnrollCount * 2)
    {
        // Just generate all the assignment in straight line code
        //  mov[dst + Js::FirstSlotIndex], undefinedOpnd
        // ...
        //  mov[dst + count - 1], undefinedOpnd
        for (unsigned int i = Js::ScopeSlots::FirstSlotIndex; i < count; i++)
        {
            GenerateMemInit(dst, sizeof(Js::Var) * i, undefinedOpnd, instr, !doStackSlots);
        }
    }
    else
    {
        // Just generate all the assignment in loop of loopUnrollCount and the rest as straight line code
        //
        //      lea currOpnd, [dst + sizeof(Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount)];
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 1] , undefinedOpnd
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 2] , undefinedOpnd
        //      ...
        //      mov [currOpnd + loopUnrollCount], undefinedOpnd
        // $LoopTop:
        //      mov [currOpnd + loopUnrollCount - 1], undefinedOpnd
        //      mov [currOpnd + loopUnrollCount - 2], undefinedOpnd
        //      ...
        //      mov [currOpnd], undefinedOpnd
        //      lea currOpnd, [currOpnd - loopUnrollCount]
        //      cmp dst, currOpnd
        //      jlt $Looptop

        uint nLoop = actualSlotCount / loopUnrollCount;
        uint loopAssignCount = nLoop * loopUnrollCount;
        uint leftOverAssignCount = actualSlotCount - loopAssignCount;        // The left over assignments

        IR::RegOpnd * currOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseCurrOpnd(currOpnd, m_func);
        InsertLea(
            currOpnd,
            IR::IndirOpnd::New(
                dst,
                sizeof(Js::Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount),
                TyMachPtr,
                func),
            instr);

        for (unsigned int i = 0; i < leftOverAssignCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount + leftOverAssignCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }

        IR::LabelInstr * loopTop = InsertLoopTopLabel(instr);
        Loop * loop = loopTop->GetLoop();

        for (unsigned int i = 0; i < loopUnrollCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }
        InsertLea(currOpnd, IR::IndirOpnd::New(currOpnd, -((int)sizeof(Js::Var) * loopUnrollCount), TyMachPtr, func), instr);

        InsertCompareBranch(dst, currOpnd, Js::OpCode::BrLt_A, true, loopTop, instr);

        loop->regAlloc.liveOnBackEdgeSyms->Set(currOpnd->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(dst->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(undefinedOpnd->AsRegOpnd()->m_sym->m_id);
    }

    if (!doStackSlots)
    {
        InsertMove(IR::RegOpnd::New(instr->m_func->GetLocalClosureSym(), TyMachPtr, func), dst, instr);
    }
    instr->Remove();
}